

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_ns_cert_type(uchar **p,uchar *end,uchar *ns_cert_type)

{
  undefined1 local_48 [8];
  mbedtls_x509_bitstring bs;
  int ret;
  uchar *ns_cert_type_local;
  uchar *end_local;
  uchar **p_local;
  
  bs.p._4_4_ = 0xffffff92;
  memset(local_48,0,0x18);
  bs.p._4_4_ = mbedtls_asn1_get_bitstring(p,end,(mbedtls_asn1_bitstring *)local_48);
  if (bs.p._4_4_ == 0) {
    if (local_48 == (undefined1  [8])0x0) {
      *ns_cert_type = '\0';
      p_local._4_4_ = 0;
    }
    else if (local_48 == (undefined1  [8])0x1) {
      *ns_cert_type = *(uchar *)bs._8_8_;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,-100,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                             ,0x54e);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,bs.p._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                           ,0x542);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_ns_cert_type(unsigned char **p,
                                  const unsigned char *end,
                                  unsigned char *ns_cert_type)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if ((ret = mbedtls_asn1_get_bitstring(p, end, &bs)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    /* A bitstring with no flags set is still technically valid, as it will mean
       that the certificate has no designated purpose at the time of creation. */
    if (bs.len == 0) {
        *ns_cert_type = 0;
        return 0;
    }

    if (bs.len != 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_INVALID_LENGTH);
    }

    /* Get actual bitstring */
    *ns_cert_type = *bs.p;
    return 0;
}